

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetLinkLibrariesCommand::InitialPass
          (cmTargetLinkLibrariesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer ppcVar2;
  cmTargetLinkLibraryType right;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  TargetType TVar6;
  PolicyStatus PVar7;
  int iVar8;
  int iVar9;
  cmake *pcVar10;
  cmTarget *pcVar11;
  string *psVar12;
  ostream *poVar13;
  pointer pbVar14;
  cmTargetLinkLibraryType llt;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  MessageType t;
  int iVar15;
  ulong uVar16;
  pointer pbVar17;
  pointer ppcVar18;
  char *pcVar19;
  string local_1c8;
  ostringstream e;
  
  psVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar12 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",
               (allocator<char> *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
LAB_001be199:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  bVar3 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,psVar12);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"can not be used on an ALIAS target.",(allocator<char> *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_001be199;
  }
  pcVar10 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  pcVar11 = cmGlobalGenerator::FindTarget
                      (pcVar10->GlobalGenerator,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,false);
  this->Target = pcVar11;
  if (pcVar11 == (cmTarget *)0x0) {
    pcVar1 = (this->super_cmCommand).Makefile;
    ppcVar18 = (pcVar1->ImportedTargetsOwned).
               super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar2 = (pcVar1->ImportedTargetsOwned).
              super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (ppcVar18 == ppcVar2) {
        pcVar11 = this->Target;
        goto LAB_001be20e;
      }
      pcVar11 = *ppcVar18;
      psVar12 = cmTarget::GetName_abi_cxx11_(pcVar11);
      _Var4 = std::operator==(psVar12,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
      ppcVar18 = ppcVar18 + 1;
    } while (!_Var4);
    this->Target = pcVar11;
LAB_001be20e:
    if (pcVar11 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar13 = std::operator<<((ostream *)&e,"Cannot specify link libraries for target \"");
      poVar13 = std::operator<<(poVar13,(string *)
                                        (args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start);
      poVar13 = std::operator<<(poVar13,"\" ");
      std::operator<<(poVar13,"which is not built by this project.");
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        PVar7 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0016,false);
        if (PVar7 - REQUIRED_IF_USED < 2) {
          poVar13 = std::operator<<((ostream *)&e,"\n");
          cmPolicies::GetRequiredPolicyError_abi_cxx11_
                    (&local_1c8,(cmPolicies *)&DAT_00000010,id_01);
          std::operator<<(poVar13,(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        else {
          if (PVar7 == OLD) goto LAB_001be91b;
          if (PVar7 == WARN) {
            poVar13 = std::operator<<((ostream *)&e,"\n");
            poVar13 = std::operator<<(poVar13,
                                      "CMake does not support this but it used to work accidentally "
                                     );
            poVar13 = std::operator<<(poVar13,"and is being allowed for compatibility.");
            poVar13 = std::operator<<(poVar13,"\n");
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)&DAT_00000010,id_00);
            std::operator<<(poVar13,(string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            goto LAB_001be91b;
          }
        }
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      cmSystemTools::s_FatalErrorOccured = true;
LAB_001be91b:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return true;
    }
  }
  TVar6 = cmTarget::GetType(pcVar11);
  if (TVar6 != UTILITY) goto LAB_001be33c;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar7 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0039,false);
  if (PVar7 - NEW < 3) {
    t = FATAL_ERROR;
    bVar3 = true;
    pcVar19 = "must";
LAB_001be2a1:
    poVar13 = std::operator<<((ostream *)&e,"Utility target \"");
    psVar12 = cmTarget::GetName_abi_cxx11_(this->Target);
    poVar13 = std::operator<<(poVar13,(string *)psVar12);
    poVar13 = std::operator<<(poVar13,"\" ");
    poVar13 = std::operator<<(poVar13,pcVar19);
    std::operator<<(poVar13," not be used as the target of a target_link_libraries call.");
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,t,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (bVar3) {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
  }
  else if (PVar7 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x27,id);
    poVar13 = std::operator<<((ostream *)&e,(string *)&local_1c8);
    std::operator<<(poVar13,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar3 = false;
    pcVar19 = "should";
    t = AUTHOR_WARNING;
    goto LAB_001be2a1;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_001be33c:
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar14 - (long)pbVar17) < 0x21) {
    return true;
  }
  this->CurrentProcessingState = ProcessingLinkLibraries;
  llt = GENERAL_LibraryType;
  bVar3 = false;
  uVar16 = 1;
  do {
    if ((ulong)((long)pbVar14 - (long)pbVar17 >> 5) <= uVar16) {
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar13 = std::operator<<((ostream *)&e,"The \"");
        poVar13 = std::operator<<(poVar13,LinkLibraryTypeNames[llt]);
        std::operator<<(poVar13,"\" argument must be followed by a library.");
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      PVar7 = cmTarget::GetPolicyStatusCMP0022(this->Target);
      if (WARN < PVar7) {
        return true;
      }
      if (this->CurrentProcessingState == ProcessingLinkLibraries) {
        return true;
      }
      pcVar11 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&local_1c8);
      pcVar19 = cmTarget::GetProperty(pcVar11,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (pcVar19 != (char *)0x0) {
        return true;
      }
      pcVar11 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&local_1c8);
      cmTarget::SetProperty(pcVar11,(string *)&e,"");
LAB_001be8a0:
      std::__cxx11::string::~string((string *)&e);
      return true;
    }
    bVar5 = std::operator==(pbVar17 + uVar16,"LINK_INTERFACE_LIBRARIES");
    iVar15 = (int)uVar16;
    if (bVar5) {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if (iVar15 != 1) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,
                   "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                   ,(allocator<char> *)&local_1c8);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
        goto LAB_001be8a0;
      }
    }
    else {
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar16,"INTERFACE");
      if (bVar5) {
        if ((iVar15 != 1) &&
           ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
            ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,
                     "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                     ,(allocator<char> *)&local_1c8);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
          goto LAB_001be8a0;
        }
        this->CurrentProcessingState = ProcessingKeywordLinkInterface;
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar16,"LINK_PUBLIC");
        if (bVar5) {
          if (((iVar15 != 1) && (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
             (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,
                       "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                       ,(allocator<char> *)&local_1c8);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
            goto LAB_001be8a0;
          }
          this->CurrentProcessingState = ProcessingPlainPublicInterface;
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16,"PUBLIC");
          if (bVar5) {
            if ((iVar15 != 1) &&
               ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&e,
                         "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                         ,(allocator<char> *)&local_1c8);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
              goto LAB_001be8a0;
            }
            this->CurrentProcessingState = ProcessingKeywordPublicInterface;
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar16,
                                    "LINK_PRIVATE");
            if (bVar5) {
              if (((iVar15 != 1) && (this->CurrentProcessingState != ProcessingPlainPublicInterface)
                  ) && (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,(allocator<char> *)&local_1c8);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                goto LAB_001be8a0;
              }
              this->CurrentProcessingState = ProcessingPlainPrivateInterface;
            }
            else {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar16,"PRIVATE")
              ;
              if (bVar5) {
                if ((iVar15 != 1) &&
                   ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                    ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e,
                             "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,(allocator<char> *)&local_1c8);
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                  goto LAB_001be8a0;
                }
                this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
              }
              else {
                bVar5 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar16,"debug")
                ;
                if (bVar5) {
                  if (bVar3) {
                    right = DEBUG_LibraryType;
LAB_001be526:
                    LinkLibraryTypeSpecifierWarning(this,llt,right);
                    llt = right;
                  }
                  else {
                    llt = DEBUG_LibraryType;
                  }
                }
                else {
                  bVar5 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar16,
                                          "optimized");
                  if (bVar5) {
                    if (bVar3) {
                      right = OPTIMIZED_LibraryType;
                      goto LAB_001be526;
                    }
                    llt = OPTIMIZED_LibraryType;
                  }
                  else {
                    bVar5 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar16,
                                            "general");
                    if (!bVar5) {
                      if (bVar3) {
                        bVar5 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar16,llt);
                        bVar3 = false;
                        if (!bVar5) {
                          return false;
                        }
                      }
                      else {
                        std::__cxx11::string::string
                                  ((string *)&e,
                                   (string *)
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
                        std::__cxx11::string::append((char *)&e);
                        pcVar19 = cmMakefile::GetDefinition
                                            ((this->super_cmCommand).Makefile,(string *)&e);
                        if (pcVar19 == (char *)0x0) {
                          llt = GENERAL_LibraryType;
                        }
                        else {
                          iVar8 = strcmp(pcVar19,"debug");
                          iVar9 = strcmp(pcVar19,"optimized");
                          llt = OPTIMIZED_LibraryType;
                          if (iVar9 != 0) {
                            llt = (cmTargetLinkLibraryType)(iVar8 == 0);
                          }
                        }
                        bVar5 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar16,llt);
                        std::__cxx11::string::~string((string *)&e);
                        if (!bVar5) {
                          return false;
                        }
                      }
                      goto LAB_001be579;
                    }
                    if (bVar3) {
                      LinkLibraryTypeSpecifierWarning(this,llt,0);
                    }
                    llt = GENERAL_LibraryType;
                  }
                }
                bVar3 = true;
              }
            }
          }
        }
      }
    }
LAB_001be579:
    uVar16 = (ulong)(iVar15 + 1);
    pbVar17 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

bool cmTargetLinkLibrariesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  // Must have at least one argument.
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Alias targets cannot be on the LHS of this command.
  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    const std::vector<cmTarget*>& importedTargets =
      this->Makefile->GetOwnedImportedTargets();
    for (cmTarget* importedTarget : importedTargets) {
      if (importedTarget->GetName() == args[0]) {
        this->Target = importedTarget;
        break;
      }
    }
  }
  if (!this->Target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccured();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (this->Target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "Utility target \"" << this->Target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  this->CurrentProcessingState = ProcessingLinkLibraries;

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "LINK_INTERFACE_LIBRARIES") {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if (i != 1) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_INTERFACE_LIBRARIES option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
    } else if (args[i] == "INTERFACE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordLinkInterface;
    } else if (args[i] == "LINK_PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPublicInterface;
    } else if (args[i] == "PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPublicInterface;
    } else if (args[i] == "LINK_PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
    } else if (args[i] == "PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
    } else if (args[i] == "debug") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, DEBUG_LibraryType);
      }
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (args[i] == "optimized") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, OPTIMIZED_LibraryType);
      }
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (args[i] == "general") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, GENERAL_LibraryType);
      }
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    } else {
      // Lookup old-style cache entry if type is unspecified.  So if you
      // do a target_link_libraries(foo optimized bar) it will stay optimized
      // and not use the lookup.  As there may be the case where someone has
      // specified that a library is both debug and optimized.  (this check is
      // only there for backwards compatibility when mixing projects built
      // with old versions of CMake and new)
      llt = GENERAL_LibraryType;
      std::string linkType = args[0];
      linkType += "_LINK_TYPE";
      const char* linkTypeString = this->Makefile->GetDefinition(linkType);
      if (linkTypeString) {
        if (strcmp(linkTypeString, "debug") == 0) {
          llt = DEBUG_LibraryType;
        }
        if (strcmp(linkTypeString, "optimized") == 0) {
          llt = OPTIMIZED_LibraryType;
        }
      }
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    }
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    std::ostringstream e;
    e << "The \"" << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[llt]
      << "\" argument must be followed by a library.";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
  }

  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      this->CurrentProcessingState != ProcessingLinkLibraries &&
      !this->Target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    this->Target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}